

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.cpp
# Opt level: O1

void SplitString(string *input,char delim,
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *res)

{
  size_type sVar1;
  long lVar2;
  undefined7 in_register_00000031;
  size_type sVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(res);
  sVar1 = input->_M_string_length;
  sVar3 = 0;
  lVar2 = std::__cxx11::string::find((char)input,CONCAT71(in_register_00000031,delim) & 0xffffffff);
  if (lVar2 != -1) {
    do {
      std::__cxx11::string::substr((ulong)&local_50,(ulong)input);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)res,&local_50)
      ;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      sVar3 = lVar2 + 1;
      lVar2 = std::__cxx11::string::find((char)input,(ulong)(uint)(int)delim);
    } while (lVar2 != -1);
  }
  if (sVar3 != sVar1) {
    std::__cxx11::string::substr((ulong)&local_50,(ulong)input);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)res,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

void SplitString(const string& input, char delim, vector<string>& res)
{
    res.clear();
    size_t pos1, pos2;
    size_t input_length = input.size();
    pos2 = input.find(delim);
    pos1 = 0;
    while (pos2 != string::npos)
    {
        res.emplace_back(input.substr(pos1, pos2 - pos1));
        pos1 = pos2 + 1;
        pos2 = input.find(delim, pos1);
    }
    if (pos1 != input_length)
    {
        res.emplace_back(input.substr(pos1));
    }
}